

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O0

int dict2pid_free(dict2pid_t *d2p)

{
  int iVar1;
  dict2pid_t *d2p_local;
  
  if (d2p == (dict2pid_t *)0x0) {
    d2p_local._4_4_ = 0;
  }
  else {
    iVar1 = d2p->refcount + -1;
    d2p->refcount = iVar1;
    if (iVar1 < 1) {
      if (d2p->ldiph_lc != (s3ssid_t ***)0x0) {
        ckd_free_3d(d2p->ldiph_lc);
      }
      if (d2p->lrdiph_rc != (s3ssid_t ***)0x0) {
        ckd_free_3d(d2p->lrdiph_rc);
      }
      if (d2p->rssid != (xwdssid_t **)0x0) {
        free_compress_map(d2p->rssid,d2p->mdef->n_ciphone);
      }
      if (d2p->lrssid != (xwdssid_t **)0x0) {
        free_compress_map(d2p->lrssid,d2p->mdef->n_ciphone);
      }
      bin_mdef_free(d2p->mdef);
      dict_free(d2p->dict);
      ckd_free(d2p);
      d2p_local._4_4_ = 0;
    }
    else {
      d2p_local._4_4_ = d2p->refcount;
    }
  }
  return d2p_local._4_4_;
}

Assistant:

int
dict2pid_free(dict2pid_t * d2p)
{
    if (d2p == NULL)
        return 0;
    if (--d2p->refcount > 0)
        return d2p->refcount;

    if (d2p->ldiph_lc)
        ckd_free_3d((void ***) d2p->ldiph_lc);

    if (d2p->lrdiph_rc)
        ckd_free_3d((void ***) d2p->lrdiph_rc);

    if (d2p->rssid)
        free_compress_map(d2p->rssid, bin_mdef_n_ciphone(d2p->mdef));

    if (d2p->lrssid)
        free_compress_map(d2p->lrssid, bin_mdef_n_ciphone(d2p->mdef));

    bin_mdef_free(d2p->mdef);
    dict_free(d2p->dict);
    ckd_free(d2p);
    return 0;
}